

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ReusableStringStream * __thiscall
Catch::ReusableStringStream::operator<<(ReusableStringStream *this,char **value)

{
  undefined8 *in_RSI;
  ReusableStringStream *in_RDI;
  
  std::operator<<(in_RDI->m_oss,(char *)*in_RSI);
  return in_RDI;
}

Assistant:

auto operator << ( T const& value ) -> ReusableStringStream& {
            *m_oss << value;
            return *this;
        }